

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutTable.cpp
# Opt level: O0

void __thiscall ShortcutTable::set(ShortcutTable *this,Shortcut shortcut,QKeySequence *seq)

{
  bool bVar1;
  optional *this_00;
  QKeySequence *this_01;
  value_type *ref;
  QKeySequence *seq_local;
  Shortcut shortcut_local;
  ShortcutTable *this_local;
  
  this_00 = (optional *)
            std::array<std::optional<QKeySequence>,_33UL>::operator[](&this->mTable,(ulong)shortcut)
  ;
  bVar1 = std::optional::operator_cast_to_bool(this_00);
  if (bVar1) {
    this_01 = std::optional<QKeySequence>::operator*((optional<QKeySequence> *)this_00);
    QKeySequence::operator=(this_01,seq);
  }
  else {
    std::optional<QKeySequence>::operator=((optional<QKeySequence> *)this_00,seq);
  }
  return;
}

Assistant:

void ShortcutTable::set(Shortcut shortcut, QKeySequence const& seq) noexcept {
    auto &ref = mTable[shortcut];
    if (ref) {
        *ref = seq;
    } else {
        ref = seq;
    }
}